

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void plutovg_path_quad_to(plutovg_path_t *path,float x1,float y1,float x2,float y2)

{
  float cp2y;
  float cp2x;
  float cp1y;
  float cp1x;
  float current_y;
  float current_x;
  float y2_local;
  float x2_local;
  float y1_local;
  float x1_local;
  plutovg_path_t *path_local;
  
  current_y = y2;
  current_x = x2;
  y2_local = y1;
  x2_local = x1;
  _y1_local = path;
  plutovg_path_get_current_point(path,&cp1x,&cp1y);
  plutovg_path_cubic_to
            (_y1_local,x2_local * 0.6666667 + cp1x * 0.33333334,
             y2_local * 0.6666667 + cp1y * 0.33333334,x2_local * 0.6666667 + current_x * 0.33333334,
             y2_local * 0.6666667 + current_y * 0.33333334,current_x,current_y);
  return;
}

Assistant:

void plutovg_path_quad_to(plutovg_path_t* path, float x1, float y1, float x2, float y2)
{
    float current_x, current_y;
    plutovg_path_get_current_point(path, &current_x, &current_y);
    float cp1x = 2.f / 3.f * x1 + 1.f / 3.f * current_x;
    float cp1y = 2.f / 3.f * y1 + 1.f / 3.f * current_y;
    float cp2x = 2.f / 3.f * x1 + 1.f / 3.f * x2;
    float cp2y = 2.f / 3.f * y1 + 1.f / 3.f * y2;
    plutovg_path_cubic_to(path, cp1x, cp1y, cp2x, cp2y, x2, y2);
}